

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

ModuleDeclarationSyntax * __thiscall
slang::parsing::Parser::parseModule
          (Parser *this,AttrList attributes,SyntaxKind parentKind,bool *anyLocalModules)

{
  size_type sVar1;
  TokenKind kind;
  TokenKind TVar2;
  SyntaxKind parentKind_00;
  int iVar3;
  ModuleHeaderSyntax *pMVar4;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  ModuleDeclarationSyntax *pMVar5;
  templated_iterator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>
  tVar6;
  byte bVar7;
  byte bVar8;
  Token TVar9;
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>::templated_iterator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_bool>
  pVar10;
  bool anyLocalModules_1;
  Token endmodule;
  string_view name;
  MemberSyntax *member;
  bool local_101;
  TokenKind local_100;
  TokenKind local_fe;
  _Storage<slang::TimeScale,_true> local_fc;
  undefined1 local_f8;
  SyntaxKind local_f4;
  Preprocessor *local_f0;
  pointer local_e8;
  char local_e0 [8];
  ModuleHeaderSyntax *local_d8;
  pointer local_d0;
  Token local_c8;
  undefined1 local_b8 [32];
  pointer local_98;
  char local_90 [8];
  SyntaxList<slang::syntax::MemberSyntax> local_60;
  
  local_d0 = attributes.data_;
  local_f0 = (this->super_ParserBase).window.tokenSource;
  local_f0->designElementDepth = local_f0->designElementDepth + 1;
  pMVar4 = parseModuleHeader(this);
  kind = slang::syntax::SyntaxFacts::getModuleEndKind((pMVar4->moduleKeyword).kind);
  if (parentKind != CompilationUnit) {
    local_b8._0_16_ = (undefined1  [16])Token::valueText(&pMVar4->name);
    if (local_b8._0_8_ != 0) {
      if (*anyLocalModules == false) {
        SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::emplace_back<>(&(this->moduleDeclStack).
                          super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        );
        *anyLocalModules = true;
      }
      sVar1 = (this->moduleDeclStack).
              super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              .len;
      if (sVar1 == 0) {
        assert::assertFailed
                  ("len",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                   ,0x62,
                   "reference slang::SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char>, slang::Hasher<std::basic_string_view<char>>>>::back() [T = ska::flat_hash_set<std::basic_string_view<char>, slang::Hasher<std::basic_string_view<char>>>]"
                  );
      }
      ska::detailv3::
      sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
      ::emplace<std::basic_string_view<char,std::char_traits<char>>&>
                ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                  *)((this->moduleDeclStack).
                     super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     .data_ + (sVar1 - 1)),
                 (basic_string_view<char,_std::char_traits<char>_> *)local_b8);
    }
  }
  local_e0 = (char  [8])attributes.size_;
  local_d8 = pMVar4;
  parentKind_00 = slang::syntax::SyntaxFacts::getModuleDeclarationKind((pMVar4->moduleKeyword).kind)
  ;
  local_fe = local_f0->defaultNetType;
  local_100 = local_f0->unconnectedDrive;
  local_f8 = (local_f0->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
             _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged;
  local_fc = (local_f0->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
             _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_f4 = this->currentDefinitionKind;
  this->currentDefinitionKind = parentKind_00;
  Token::Token(&local_c8);
  local_b8._8_8_ = 0;
  local_b8._0_8_ = local_b8 + 0x18;
  local_b8._16_8_ = 8;
  local_101 = false;
  bVar7 = 0;
  do {
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    TVar2 = TVar9.kind;
    if (kind != TVar2 && TVar2 != EndOfFile) {
      local_60.super_SyntaxListBase._vptr_SyntaxListBase =
           (_func_int **)parseMember(this,parentKind_00,&local_101);
      if ((MemberSyntax *)local_60.super_SyntaxListBase._vptr_SyntaxListBase == (MemberSyntax *)0x0)
      {
        bVar8 = ~bVar7;
        bVar7 = 1;
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)(bVar8 & 1) << 0x20 | 0x350005));
      }
      else {
        checkMemberAllowed(this,(SyntaxNode *)local_60.super_SyntaxListBase._vptr_SyntaxListBase,
                           parentKind_00);
        SmallVectorBase<slang::syntax::MemberSyntax*>::
        emplace_back<slang::syntax::MemberSyntax*const&>
                  ((SmallVectorBase<slang::syntax::MemberSyntax*> *)local_b8,
                   (MemberSyntax **)&local_60);
        bVar7 = 0;
      }
    }
  } while (kind != TVar2 && TVar2 != EndOfFile);
  if (local_101 == true) {
    SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  local_c8 = ParserBase::expect(&this->super_ParserBase,kind);
  iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)local_b8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_c8.info);
  local_e8 = (pointer)CONCAT44(extraout_var,iVar3);
  if ((SyntaxNode *)local_b8._0_8_ != (SyntaxNode *)(local_b8 + 0x18)) {
    free((void *)local_b8._0_8_);
  }
  this->currentDefinitionKind = local_f4;
  local_f0->designElementDepth = local_f0->designElementDepth + -1;
  endBlock = parseNamedBlockClause(this);
  pMVar4 = local_d8;
  TVar9.kind = (local_d8->name).kind;
  TVar9._2_1_ = (local_d8->name).field_0x2;
  TVar9.numFlags.raw = (local_d8->name).numFlags.raw;
  TVar9.rawLen = (local_d8->name).rawLen;
  TVar9.info = (local_d8->name).info;
  checkBlockNames(this,TVar9,endBlock);
  local_b8._16_4_ = 1;
  local_b8[0x18] = local_e0[0];
  local_b8[0x19] = local_e0[1];
  local_b8[0x1a] = local_e0[2];
  local_b8[0x1b] = local_e0[3];
  local_b8[0x1c] = local_e0[4];
  local_b8[0x1d] = local_e0[5];
  local_b8[0x1e] = local_e0[6];
  local_b8[0x1f] = local_e0[7];
  local_98 = local_d0;
  local_90[0] = local_e0[0];
  local_90[1] = local_e0[1];
  local_90[2] = local_e0[2];
  local_90[3] = local_e0[3];
  local_90[4] = local_e0[4];
  local_90[5] = local_e0[5];
  local_90[6] = local_e0[6];
  local_90[7] = local_e0[7];
  local_b8._0_16_ = ZEXT816(0x4ea348);
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ = local_e8;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed010;
  pMVar5 = slang::syntax::SyntaxFactory::moduleDeclaration
                     (&this->factory,parentKind_00,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_b8,pMVar4,
                      &local_60,local_c8,endBlock);
  local_b8._0_8_ = pMVar5;
  pVar10 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::syntax::SyntaxNode_const*,slang::Hasher<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::Hasher<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,std::equal_to<slang::syntax::SyntaxNode_const*>>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>>
           ::
           emplace<slang::syntax::SyntaxNode_const*,ska::flat_hash_map<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node,slang::Hasher<slang::syntax::SyntaxNode_const*>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::syntax::SyntaxNode_const*,slang::Hasher<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::Hasher<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,std::equal_to<slang::syntax::SyntaxNode_const*>>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>>
                       *)&this->meta,(SyntaxNode **)local_b8,(convertible_to_value *)&local_60);
  tVar6 = pVar10.first.current;
  ((tVar6.current)->field_1).value.second.defaultNetType = local_fe;
  ((tVar6.current)->field_1).value.second.unconnectedDrive = local_100;
  *(_Storage<slang::TimeScale,_true> *)((long)&(tVar6.current)->field_1 + 0xc) = local_fc;
  *(undefined1 *)((long)&(tVar6.current)->field_1 + 0x10) = local_f8;
  return pMVar5;
}

Assistant:

ModuleDeclarationSyntax& Parser::parseModule(AttrList attributes, SyntaxKind parentKind,
                                             bool& anyLocalModules) {
    // Tell the preprocessor that we're inside a design element for the duration of this function.
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto& header = parseModuleHeader();
    auto endKind = getModuleEndKind(header.moduleKeyword.kind);

    // If the parent isn't a compilation unit, that means we're a nested definition.
    // Record our name in the decl stack so that child instantiations know they're
    // referencing a local module and not a global one.
    if (parentKind != SyntaxKind::CompilationUnit) {
        auto name = header.name.valueText();
        if (!name.empty()) {
            if (!anyLocalModules) {
                moduleDeclStack.emplace_back();
                anyLocalModules = true;
            }
            moduleDeclStack.back().emplace(name);
        }
    }

    SyntaxKind declKind = getModuleDeclarationKind(header.moduleKeyword.kind);
    ParserMetadata::Node node{pp.getDefaultNetType(), pp.getUnconnectedDrive(), pp.getTimeScale()};

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = declKind;

    Token endmodule;
    auto members = parseMemberList<MemberSyntax>(
        endKind, endmodule, declKind, [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;
    pp.popDesignElementStack();

    auto endName = parseNamedBlockClause();
    checkBlockNames(header.name, endName);

    auto& result = factory.moduleDeclaration(declKind, attributes, header, members, endmodule,
                                             endName);

    meta.nodeMap[&result] = node;
    return result;
}